

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasindex.cpp
# Opt level: O2

void __thiscall LASindex::print(LASindex *this)

{
  BOOL BVar1;
  uint uVar2;
  LASinterval *pLVar3;
  ulong uVar4;
  U32 UVar5;
  uint uVar6;
  uint uVar7;
  uint local_34;
  
  LASinterval::get_cells(this->interval);
  pLVar3 = this->interval;
  uVar6 = 0;
  uVar7 = 0;
  local_34 = 0;
  uVar2 = 0;
  while( true ) {
    BVar1 = LASinterval::has_cells(pLVar3);
    if (!BVar1) break;
    pLVar3 = this->interval;
    UVar5 = 0;
    uVar4 = 0;
    while( true ) {
      BVar1 = LASinterval::has_intervals(pLVar3);
      pLVar3 = this->interval;
      if (!BVar1) break;
      UVar5 = ((UVar5 + pLVar3->end) - pLVar3->start) + 1;
      uVar4 = (ulong)((int)uVar4 + 1);
    }
    if (UVar5 != pLVar3->total) {
      LASMessage(LAS_VERBOSE,"total_check %d != interval->total %d",(ulong)UVar5);
      pLVar3 = this->interval;
      UVar5 = pLVar3->total;
    }
    LASMessage(LAS_VERY_VERBOSE,"cell %d intervals %d full %d total %d (%.2f)",
               (double)(((float)pLVar3->full * 100.0) / (float)UVar5),(ulong)(uint)pLVar3->index,
               uVar4,(ulong)pLVar3->full,(ulong)UVar5);
    pLVar3 = this->interval;
    uVar7 = uVar7 + pLVar3->full;
    uVar6 = uVar6 + 1;
    local_34 = local_34 + pLVar3->total;
    uVar2 = uVar2 + (int)uVar4;
  }
  LASMessage(LAS_VERY_VERBOSE,"total cells/intervals %d/%d full %d (%.2f)",
             (double)(((float)uVar7 * 100.0) / (float)local_34),(ulong)uVar6,(ulong)uVar2,
             (ulong)uVar7);
  return;
}

Assistant:

void LASindex::print()
{
  U32 total_cells = 0;
  U32 total_full = 0;
  U32 total_total = 0;
  U32 total_intervals = 0;
  U32 total_check;
  U32 intervals;
  interval->get_cells();
  while (interval->has_cells())
  {
    total_check = 0;
    intervals = 0;
    while (interval->has_intervals())
    {
      total_check += interval->end-interval->start+1;
      intervals++;
    }
    if (total_check != interval->total)
    {
      LASMessage(LAS_VERBOSE, "total_check %d != interval->total %d", total_check, interval->total);
    }
    LASMessage(LAS_VERY_VERBOSE, "cell %d intervals %d full %d total %d (%.2f)", interval->index, intervals, interval->full, interval->total, 100.0f*interval->full/interval->total);
    total_cells++;
    total_full += interval->full;
    total_total += interval->total;
    total_intervals += intervals;
  }
  LASMessage(LAS_VERY_VERBOSE, "total cells/intervals %d/%d full %d (%.2f)", total_cells, total_intervals, total_full, 100.0f*total_full/total_total);
}